

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint16_t *puVar4;
  void **ppvVar5;
  void *pvVar6;
  int iVar7;
  _Bool _Var8;
  int iVar9;
  ushort *puVar10;
  array_container_t *paVar11;
  array_container_t *paVar12;
  byte type2;
  uint8_t uVar13;
  ushort uVar14;
  long lVar15;
  uint8_t uVar16;
  uint uVar17;
  ushort *puVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint32_t end;
  uint32_t new_begin;
  uint32_t begin;
  uint8_t result_type;
  uint8_t local_51;
  array_container_t *local_50;
  array_container_t *local_48;
  roaring_array_t *local_40;
  uint32_t local_38;
  uint32_t local_34;
  
  if (x1 == x2) {
    __assert_fail("x1 != x2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x3ec9,
                  "void roaring_bitmap_andnot_inplace(roaring_bitmap_t *, const roaring_bitmap_t *)"
                 );
  }
  local_51 = '\0';
  uVar2 = (x2->high_low_container).size;
  if (uVar2 == 0) {
    return;
  }
  end = (x1->high_low_container).size;
  if (end == 0) {
    ra_reset(&x1->high_low_container);
    return;
  }
  puVar10 = (x1->high_low_container).keys;
  uVar14 = *(x2->high_low_container).keys;
  uVar19 = 0;
  begin = 0;
  new_begin = 0;
  puVar18 = puVar10;
LAB_00117b91:
  do {
    uVar1 = *puVar18;
    while (uVar1 != uVar14) {
      if (uVar1 < uVar14) {
        if (begin != new_begin) {
          if (((roaring_array_t *)&(x1->high_low_container).size)->size <= (int)new_begin)
          goto LAB_00117f94;
          ppvVar5 = (x1->high_low_container).containers;
          pvVar6 = ppvVar5[begin & 0xffff];
          uVar16 = (x1->high_low_container).typecodes[begin & 0xffff];
          puVar10[(int)new_begin] = uVar1;
          ppvVar5[(int)new_begin] = pvVar6;
          (x1->high_low_container).typecodes[(int)new_begin] = uVar16;
        }
        new_begin = new_begin + 1;
        begin = begin + 1;
        if (begin == end) goto LAB_00117f46;
        puVar10 = (x1->high_low_container).keys;
        puVar18 = puVar10 + (begin & 0xffff);
        goto LAB_00117b91;
      }
      uVar3 = (x2->high_low_container).size;
      puVar4 = (x2->high_low_container).keys;
      uVar21 = uVar19 + 1;
      uVar17 = uVar21;
      if (((int)uVar21 < (int)uVar3) && (puVar4[(int)uVar21] < uVar1)) {
        uVar19 = uVar19 + 2;
        iVar9 = 1;
        if ((int)uVar19 < (int)uVar3) {
          iVar9 = 1;
          do {
            uVar20 = (ulong)uVar19;
            uVar14 = puVar4[(int)uVar19];
            if (uVar1 <= uVar14) goto LAB_00117bf9;
            iVar7 = iVar9 * 2;
            uVar19 = uVar21 + iVar9 * 2;
            iVar9 = iVar7;
          } while ((int)uVar19 < (int)uVar3);
        }
        uVar14 = puVar4[(long)(int)uVar3 + -1];
        uVar20 = (long)(int)uVar3 - 1;
LAB_00117bf9:
        uVar19 = (uint)uVar20;
        uVar17 = uVar19;
        if (((uVar14 != uVar1) && (uVar17 = uVar3, uVar1 <= uVar14)) &&
           (uVar17 = uVar19, (iVar9 >> 1) + uVar21 + 1 != uVar19)) {
          uVar21 = (iVar9 >> 1) + uVar21;
          do {
            uVar17 = (int)(uVar21 + (uint)uVar20) >> 1;
            if (puVar4[(int)uVar17] == uVar1) break;
            uVar19 = uVar17;
            if (puVar4[(int)uVar17] < uVar1) {
              uVar19 = (uint)uVar20;
              uVar21 = uVar17;
            }
            uVar20 = (ulong)uVar19;
            uVar17 = uVar19;
          } while (uVar21 + 1 != uVar19);
        }
      }
      if (uVar17 == uVar2) goto LAB_00117f1f;
      uVar19 = uVar17;
      uVar14 = puVar4[uVar17 & 0xffff];
    }
    paVar11 = (array_container_t *)(x1->high_low_container).containers[begin & 0xffff];
    type2 = (x2->high_low_container).typecodes[uVar19 & 0xffff];
    paVar12 = (array_container_t *)(x2->high_low_container).containers[uVar19 & 0xffff];
    local_38 = end;
    local_34 = new_begin;
    if ((x1->high_low_container).typecodes[begin & 0xffff] == 4) {
      local_50 = paVar11;
      paVar11 = (array_container_t *)container_andnot(paVar11,'\x04',paVar12,type2,&local_51);
      local_40 = &x1->high_low_container;
      shared_container_free((shared_container_t *)local_50);
      x1 = (roaring_bitmap_t *)local_40;
      uVar16 = local_51;
      goto LAB_00117e57;
    }
    if (type2 == 4) {
      type2 = *(byte *)&paVar12->array;
      if (type2 == 4) goto LAB_00117fd2;
      paVar12 = *(array_container_t **)paVar12;
    }
    local_48 = (array_container_t *)0x0;
    switch((uint)type2 + (uint)(x1->high_low_container).typecodes[begin & 0xffff] * 4) {
    case 5:
      _Var8 = bitset_bitset_container_iandnot
                        ((bitset_container_t *)paVar11,(bitset_container_t *)paVar12,&local_48);
      break;
    case 6:
      _Var8 = bitset_array_container_iandnot((bitset_container_t *)paVar11,paVar12,&local_48);
      break;
    case 7:
      _Var8 = bitset_run_container_iandnot
                        ((bitset_container_t *)paVar11,(run_container_t *)paVar12,&local_48);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x17cd,
                    "container_t *container_iandnot(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                   );
    case 9:
      local_51 = '\x02';
      local_50 = paVar11;
      array_bitset_container_andnot(paVar11,(bitset_container_t *)paVar12,paVar11);
      goto LAB_00117e04;
    case 10:
      local_50 = paVar11;
      array_container_andnot(paVar11,paVar12,paVar11);
      local_51 = '\x02';
      goto LAB_00117e04;
    case 0xb:
      local_51 = '\x02';
      local_50 = paVar11;
      array_run_container_andnot(paVar11,(run_container_t *)paVar12,paVar11);
LAB_00117e04:
      paVar11 = local_50;
      uVar16 = '\x02';
      goto LAB_00117e57;
    case 0xd:
      local_50 = paVar11;
      _Var8 = run_bitset_container_andnot
                        ((run_container_t *)paVar11,(bitset_container_t *)paVar12,&local_48);
      local_40 = &x1->high_low_container;
      run_container_free((run_container_t *)local_50);
      local_51 = '\x02' - _Var8;
      paVar11 = local_48;
      x1 = (roaring_bitmap_t *)local_40;
      uVar16 = local_51;
      goto LAB_00117e57;
    case 0xe:
      local_50 = paVar11;
      iVar9 = run_array_container_andnot((run_container_t *)paVar11,paVar12,&local_48);
      goto LAB_00117dd6;
    case 0xf:
      local_50 = paVar11;
      iVar9 = run_run_container_andnot
                        ((run_container_t *)paVar11,(run_container_t *)paVar12,&local_48);
LAB_00117dd6:
      local_40 = (roaring_array_t *)CONCAT44(local_40._4_4_,iVar9);
      run_container_free((run_container_t *)local_50);
      paVar11 = local_48;
      local_51 = (uint8_t)local_40;
      uVar16 = (uint8_t)local_40;
      goto LAB_00117e57;
    }
    local_51 = '\x02' - _Var8;
    paVar11 = local_48;
    uVar16 = local_51;
LAB_00117e57:
    new_begin = local_34;
    paVar12 = paVar11;
    uVar13 = uVar16;
    if (uVar16 == '\x04') {
      uVar13 = *(uint8_t *)&paVar11->array;
      if (uVar13 == '\x04') {
LAB_00117fd2:
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      paVar12 = *(array_container_t **)paVar11;
    }
    if ((uVar13 == '\x03') || (uVar13 == '\x02')) {
      if (paVar12->cardinality < 1) goto LAB_00117eda;
LAB_00117eb1:
      if (((roaring_array_t *)&(x1->high_low_container).size)->size <= (int)local_34) {
LAB_00117f94:
        __assert_fail("i < ra->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1a55,
                      "void ra_replace_key_and_container_at_index(roaring_array_t *, int32_t, uint16_t, container_t *, uint8_t)"
                     );
      }
      lVar15 = (long)(int)local_34;
      new_begin = local_34 + 1;
      (x1->high_low_container).keys[lVar15] = uVar1;
      (x1->high_low_container).containers[lVar15] = paVar11;
      (x1->high_low_container).typecodes[lVar15] = uVar16;
    }
    else {
      if (uVar13 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x11c6,"_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
      }
      if (paVar12->cardinality != 0) {
        if (paVar12->cardinality != -1) goto LAB_00117eb1;
        lVar15 = 0;
        do {
          if (*(long *)(paVar12->array + lVar15 * 4) != 0) goto LAB_00117eb1;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x400);
      }
LAB_00117eda:
      container_free(paVar11,uVar16);
    }
    begin = begin + 1;
    end = local_38;
    if ((begin == local_38) || (uVar19 = uVar19 + 1, uVar19 == uVar2)) {
LAB_00117f1f:
      if (end - begin != 0 && (int)begin <= (int)end) {
        if ((int)new_begin < (int)begin) {
          ra_copy_range(&x1->high_low_container,begin,end,new_begin);
        }
        new_begin = new_begin + (end - begin);
      }
LAB_00117f46:
      if ((int)new_begin <= ((roaring_array_t *)&(x1->high_low_container).size)->size) {
        ((roaring_array_t *)&(x1->high_low_container).size)->size = new_begin;
        return;
      }
      __assert_fail("new_length <= ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x47af,"void ra_downsize(roaring_array_t *, int32_t)");
    }
    puVar10 = (x1->high_low_container).keys;
    puVar18 = puVar10 + (begin & 0xffff);
    uVar14 = (x2->high_low_container).keys[uVar19 & 0xffff];
  } while( true );
}

Assistant:

void roaring_bitmap_andnot_inplace(roaring_bitmap_t *x1,
                                   const roaring_bitmap_t *x2) {
    assert(x1 != x2);

    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;
    int intersection_size = 0;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_clear(x1);
        return;
    }

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_andnot(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            }
            else {
                c = container_iandnot(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size++, s1,
                                                      c, result_type);
            } else {
                container_free(c, result_type);
            }

            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            if (pos1 != intersection_size) {
                container_t *c1 = ra_get_container_at_index(
                                        &x1->high_low_container, pos1, &type1);

                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size, s1, c1,
                                                      type1);
            }
            intersection_size++;
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }

    if (pos1 < length1) {
        // all containers between intersection_size and
        // pos1 are junk.  However, they have either been moved
        // (thus still referenced) or involved in an iandnot
        // that will clean up all containers that could not be reused.
        // Thus we should not free the junk containers between
        // intersection_size and pos1.
        if (pos1 > intersection_size) {
            // left slide of remaining items
            ra_copy_range(&x1->high_low_container, pos1, length1,
                          intersection_size);
        }
        // else current placement is fine
        intersection_size += (length1 - pos1);
    }
    ra_downsize(&x1->high_low_container, intersection_size);
}